

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGlobalVC.cxx
# Opt level: O0

bool __thiscall cmCTestGlobalVC::WriteXMLUpdates(cmCTestGlobalVC *this,cmXMLWriter *xml)

{
  cmCTest *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ostream *this_00;
  char *pcVar5;
  pointer path;
  pointer ppVar6;
  bool local_3b9;
  iterator local_380;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory>_>
  local_378;
  iterator local_370;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory>_>
  local_368;
  const_iterator di;
  ostringstream local_340 [8];
  ostringstream cmCTestLog_msg_1;
  string local_1c8 [48];
  ostringstream local_198 [8];
  ostringstream cmCTestLog_msg;
  bool result;
  cmXMLWriter *xml_local;
  cmCTestGlobalVC *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  this_00 = std::operator<<((ostream *)local_198,
                            "   Gathering version information (one . per revision):\n    ");
  std::ostream::operator<<(this_00,std::flush<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCTestVC).CTest;
  std::__cxx11::ostringstream::str();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestGlobalVC.cxx"
               ,0x6d,pcVar5,false);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  uVar3 = (*(this->super_cmCTestVC)._vptr_cmCTestVC[0xb])();
  std::__cxx11::ostringstream::ostringstream(local_340);
  std::ostream::operator<<(local_340,std::endl<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCTestVC).CTest;
  std::__cxx11::ostringstream::str();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestGlobalVC.cxx"
               ,0x6f,pcVar5,false);
  std::__cxx11::string::~string((string *)&di);
  std::__cxx11::ostringstream::~ostringstream(local_340);
  uVar4 = (*(this->super_cmCTestVC)._vptr_cmCTestVC[10])();
  local_3b9 = (uVar4 & 1) != 0 && (uVar3 & 1) != 0;
  (*(this->super_cmCTestVC)._vptr_cmCTestVC[0xc])(this,xml);
  local_370._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory>_>_>
       ::begin(&this->Dirs);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory>_>
  ::_Rb_tree_const_iterator(&local_368,&local_370);
  while( true ) {
    local_380._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory>_>_>
         ::end(&this->Dirs);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory>_>
    ::_Rb_tree_const_iterator(&local_378,&local_380);
    bVar2 = std::operator!=(&local_368,&local_378);
    if (!bVar2) break;
    path = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory>_>
           ::operator->(&local_368);
    ppVar6 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory>_>
             ::operator->(&local_368);
    WriteXMLDirectory(this,xml,&path->first,&ppVar6->second);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory>_>
    ::operator++(&local_368);
  }
  return local_3b9;
}

Assistant:

bool cmCTestGlobalVC::WriteXMLUpdates(cmXMLWriter& xml)
{
  bool result = true;
  cmCTestLog(this->CTest, HANDLER_OUTPUT,
             "   Gathering version information (one . per revision):\n"
             "    "
               << std::flush);
  result = this->LoadRevisions() && result;
  cmCTestLog(this->CTest, HANDLER_OUTPUT, std::endl);

  result = this->LoadModifications() && result;

  this->WriteXMLGlobal(xml);

  for (std::map<std::string, Directory>::const_iterator di =
         this->Dirs.begin();
       di != this->Dirs.end(); ++di) {
    this->WriteXMLDirectory(xml, di->first, di->second);
  }

  return result;
}